

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addMethod(QMetaObjectBuilder *this,QByteArray *signature,QByteArray *returnType)

{
  QMetaObjectBuilderPrivate *pQVar1;
  pointer pQVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar4;
  QMetaMethodBuilderPrivate QStack_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d;
  pQVar2 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar3 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate
            (&QStack_98,Method,signature,returnType,Public,0);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
  emplace_back<QMetaMethodBuilderPrivate>(&pQVar1->methods,&QStack_98);
  QMetaMethodBuilderPrivate::~QMetaMethodBuilderPrivate(&QStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar4._8_8_ = ((long)pQVar3 - (long)pQVar2) / 0x68 & 0xffffffff;
    QVar4._mobj = this;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addMethod(const QByteArray &signature,
                                                 const QByteArray &returnType)
{
    int index = int(d->methods.size());
    d->methods.push_back(QMetaMethodBuilderPrivate(QMetaMethod::Method, signature, returnType));
    return QMetaMethodBuilder(this, index);
}